

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O1

PixelBufferAccess *
tcu::getSubregion(PixelBufferAccess *__return_storage_ptr__,PixelBufferAccess *access,int x,int y,
                 int width,int height)

{
  IVec3 local_14;
  
  local_14.m_data[2] = 1;
  local_14.m_data[0] = width;
  local_14.m_data[1] = height;
  PixelBufferAccess::PixelBufferAccess
            (__return_storage_ptr__,(TextureFormat *)access,&local_14,
             &(access->super_ConstPixelBufferAccess).m_pitch,
             (void *)((long)(access->super_ConstPixelBufferAccess).m_data +
                     (long)(y * (access->super_ConstPixelBufferAccess).m_pitch.m_data[1]) +
                     (long)(x * (access->super_ConstPixelBufferAccess).m_pitch.m_data[0])));
  return __return_storage_ptr__;
}

Assistant:

PixelBufferAccess getSubregion (const PixelBufferAccess& access, int x, int y, int width, int height)
{
	return getSubregion(access, x, y, 0, width, height, 1);
}